

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

ImFontGlyph * ImVector_ImFontGlyph_insert(ImVector_ImFontGlyph *self,ImFontGlyph *it,ImFontGlyph v)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  ImFontGlyph *pIVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  pIVar4 = self->Data;
  if ((pIVar4 <= it) && (iVar2 = self->Size, it <= pIVar4 + iVar2)) {
    lVar7 = (long)it - (long)pIVar4;
    iVar3 = self->Capacity;
    if (iVar2 == iVar3) {
      if (iVar3 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar3 / 2 + iVar3;
      }
      iVar8 = iVar2 + 1;
      if (iVar2 + 1 < iVar6) {
        iVar8 = iVar6;
      }
      if (iVar3 < iVar8) {
        pIVar4 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar8 * 0x28);
        if (self->Data != (ImFontGlyph *)0x0) {
          memcpy(pIVar4,self->Data,(long)self->Size * 0x28);
          ImGui::MemFree(self->Data);
        }
        self->Data = pIVar4;
        self->Capacity = iVar8;
      }
    }
    lVar5 = (long)self->Size + (lVar7 >> 3) * 0x3333333333333333;
    if (lVar5 != 0 && (lVar7 >> 3) * -0x3333333333333333 <= (long)self->Size) {
      memmove((void *)((long)self->Data + lVar7 + 0x28),(void *)((long)self->Data + lVar7),
              lVar5 * 0x28);
    }
    pIVar4 = self->Data;
    *(undefined8 *)((long)pIVar4 + lVar7 + 0x20) = v._32_8_;
    puVar1 = (undefined8 *)((long)pIVar4 + lVar7 + 0x10);
    *puVar1 = v._16_8_;
    puVar1[1] = v._24_8_;
    *(undefined8 *)((long)pIVar4 + lVar7) = v._0_8_;
    ((undefined8 *)((long)pIVar4 + lVar7))[1] = v._8_8_;
    self->Size = self->Size + 1;
    return (ImFontGlyph *)(lVar7 + (long)self->Data);
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f2,"T *ImVector<ImFontGlyph>::insert(const T *, const T &) [T = ImFontGlyph]");
}

Assistant:

CIMGUI_API int igGetFrameCount()
{
    return ImGui::GetFrameCount();
}